

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

lbool __thiscall Minisat::Solver::prefetchAssumptions(Solver *this)

{
  Lit p;
  int iVar1;
  CRef CVar2;
  int local_2c;
  
  if (((this->prefetch_assumptions == true) && ((this->trail_lim).sz == 0)) &&
     (0 < (this->assumptions).sz)) {
    if (0 < this->last_used_assumptions) {
      iVar1 = 0;
      while( true ) {
        p.x = (this->assumptions).data[iVar1].x;
        if (((byte)p.x & 1 ^ (this->assigns).data[p.x >> 1].value) == 1) break;
        local_2c = (this->trail).sz;
        vec<int>::push(&this->trail_lim,&local_2c);
        if (((this->assigns).data[p.x >> 1].value & 2) != 0) {
          uncheckedEnqueue(this,p,(this->trail_lim).sz,0xffffffff);
        }
        iVar1 = (this->trail_lim).sz;
        if (((this->assumptions).sz <= iVar1) || (this->last_used_assumptions <= iVar1))
        goto LAB_001177dc;
      }
      cancelUntil(this,0,false);
    }
LAB_001177dc:
    CVar2 = propagate(this);
    if (CVar2 != 0xffffffff) {
      cancelUntil(this,0,false);
    }
  }
  return (lbool)'\x02';
}

Assistant:

lbool Solver::prefetchAssumptions()
{
    if (prefetch_assumptions && decisionLevel() == 0 && assumptions.size() > 0) {
        while (decisionLevel() < assumptions.size() && decisionLevel() < last_used_assumptions) {
            // Perform user provided assumption:
            Lit p = assumptions[decisionLevel()];

            if (value(p) == l_False) {
                // TODO: write proper conflict handling
                cancelUntil(0);
                break;
            }

            newDecisionLevel();
            if (value(p) == l_Undef) uncheckedEnqueue(p, decisionLevel(), CRef_Undef);
        }

        assert((decisionLevel() == 0 || decisionLevel() == assumptions.size()) &&
               "we propagated all assumptions by now");

        // TODO: write proper conflict handling
        CRef confl = propagate();
        if (confl != CRef_Undef) {
            cancelUntil(0);
        }
    }

    return l_Undef; // for now, we just work with the generic case
}